

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i32 gen_lea_mode(CPUM68KState_conflict *env,DisasContext_conflict2 *s,int mode,int reg0,
                     int opsize)

{
  int iVar1;
  TCGContext_conflict2 *tcg_ctx;
  uint32_t uVar2;
  uint32_t uVar3;
  TCGTemp *pTVar4;
  TCGv_i32 pTVar5;
  int32_t arg2;
  TCGv_i32 *ppTVar6;
  uint val;
  abi_ptr_conflict aVar7;
  TCGv_i32 pTVar8;
  
  tcg_ctx = s->uc->tcg_ctx;
  switch(mode) {
  case 2:
switchD_007018a2_caseD_2:
    ppTVar6 = tcg_ctx->cpu_aregs;
    if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) != 0) {
      ppTVar6 = s->writeback;
    }
    return ppTVar6[(uint)reg0];
  case 3:
    if (opsize != 7) goto switchD_007018a2_caseD_2;
    break;
  case 4:
    if (opsize != 7) {
      ppTVar6 = s->writeback;
      if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) == 0) {
        ppTVar6 = tcg_ctx->cpu_aregs;
      }
      pTVar5 = ppTVar6[(uint)reg0];
      pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
      iVar1 = s->release_count;
      if ((long)iVar1 < 8) {
        pTVar8 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
        s->release_count = iVar1 + 1;
        s->release[iVar1] = pTVar8;
        if ((reg0 == 7 && opsize == 0) && ((s->env->features & 1) != 0)) {
          arg2 = 2;
        }
        else {
          arg2 = *(int32_t *)(&DAT_00d88548 + (long)opsize * 4);
        }
        tcg_gen_subi_i32_m68k(tcg_ctx,pTVar8,pTVar5,arg2);
        return pTVar8;
      }
      goto LAB_00701adb;
    }
    break;
  case 5:
    ppTVar6 = s->writeback;
    if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) == 0) {
      ppTVar6 = tcg_ctx->cpu_aregs;
    }
    pTVar5 = ppTVar6[(uint)reg0];
    pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    iVar1 = s->release_count;
    if ((long)iVar1 < 8) {
      pTVar8 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
      s->release_count = iVar1 + 1;
      s->release[iVar1] = pTVar8;
      uVar2 = cpu_lduw_code_m68k(env,s->pc);
      s->pc = s->pc + 2;
      tcg_gen_addi_i32_m68k(tcg_ctx,pTVar8,pTVar5,(int)(short)uVar2);
      return pTVar8;
    }
    goto LAB_00701adb;
  case 6:
    ppTVar6 = tcg_ctx->cpu_aregs;
    if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) != 0) {
      ppTVar6 = s->writeback;
    }
    pTVar5 = ppTVar6[(uint)reg0];
LAB_00701a31:
    pTVar5 = gen_lea_indexed(env,s,pTVar5);
    return pTVar5;
  case 7:
    switch(reg0) {
    case 0:
      uVar2 = cpu_lduw_code_m68k(env,s->pc);
      s->pc = s->pc + 2;
      val = (uint)(short)uVar2;
      break;
    case 1:
      uVar2 = cpu_lduw_code_m68k(env,s->pc);
      aVar7 = s->pc + 2;
      s->pc = aVar7;
      uVar3 = cpu_lduw_code_m68k(env,aVar7);
      s->pc = s->pc + 2;
      val = uVar3 & 0xffff | uVar2 << 0x10;
      break;
    case 2:
      aVar7 = s->pc;
      uVar2 = cpu_lduw_code_m68k(env,aVar7);
      s->pc = s->pc + 2;
      val = (int)(short)uVar2 + aVar7;
      break;
    case 3:
      pTVar5 = tcg_ctx->NULL_QREG;
      goto LAB_00701a31;
    default:
      goto switchD_007018a2_caseD_0;
    }
    pTVar5 = tcg_const_i32_m68k(tcg_ctx,val);
    iVar1 = s->release_count;
    if ((long)iVar1 < 8) {
      s->release_count = iVar1 + 1;
      s->release[iVar1] = pTVar5;
      return pTVar5;
    }
LAB_00701adb:
    g_assertion_message_expr
              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
               ,0x91,"s->release_count < MAX_TO_RELEASE");
  }
switchD_007018a2_caseD_0:
  return tcg_ctx->NULL_QREG;
}

Assistant:

static TCGv gen_lea_mode(CPUM68KState *env, DisasContext *s,
                         int mode, int reg0, int opsize)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;
    uint16_t ext;
    uint32_t offset;

    switch (mode) {
    case 0: /* Data register direct.  */
    case 1: /* Address register direct.  */
        return tcg_ctx->NULL_QREG;
    case 3: /* Indirect postincrement.  */
        if (opsize == OS_UNSIZED) {
            return tcg_ctx->NULL_QREG;
        }
        /* fallthru */
    case 2: /* Indirect register */
        return get_areg(s, reg0);
    case 4: /* Indirect predecrememnt.  */
        if (opsize == OS_UNSIZED) {
            return tcg_ctx->NULL_QREG;
        }
        reg = get_areg(s, reg0);
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        if (reg0 == 7 && opsize == OS_BYTE &&
            m68k_feature(s->env, M68K_FEATURE_M68000)) {
            tcg_gen_subi_i32(tcg_ctx, tmp, reg, 2);
        } else {
            tcg_gen_subi_i32(tcg_ctx, tmp, reg, opsize_bytes(opsize));
        }
        return tmp;
    case 5: /* Indirect displacement.  */
        reg = get_areg(s, reg0);
        tmp = mark_to_release(s, tcg_temp_new(tcg_ctx));
        ext = read_im16(env, s);
        tcg_gen_addi_i32(tcg_ctx, tmp, reg, (int16_t)ext);
        return tmp;
    case 6: /* Indirect index + displacement.  */
        reg = get_areg(s, reg0);
        return gen_lea_indexed(env, s, reg);
    case 7: /* Other */
        switch (reg0) {
        case 0: /* Absolute short.  */
            offset = (int16_t)read_im16(env, s);
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        case 1: /* Absolute long.  */
            offset = read_im32(env, s);
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        case 2: /* pc displacement  */
            offset = s->pc;
            offset += (int16_t)read_im16(env, s);
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        case 3: /* pc index+displacement.  */
            return gen_lea_indexed(env, s, tcg_ctx->NULL_QREG);
        case 4: /* Immediate.  */
        default:
            return tcg_ctx->NULL_QREG;
        }
    }
    /* Should never happen.  */
    return tcg_ctx->NULL_QREG;
}